

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONPages(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  element_type *peVar4;
  reference pQVar5;
  QPDFObjGen og;
  JSON local_990;
  allocator<char> local_979;
  JSON local_978 [2];
  JSON local_958;
  undefined1 local_948 [40];
  JSON local_920 [2];
  JSON local_900;
  string local_8f0;
  JSON local_8d0;
  allocator<char> local_8b9;
  JSON local_8b8 [2];
  JSON local_898;
  undefined1 local_888 [40];
  JSON local_860 [2];
  JSON local_840;
  JSON local_830;
  undefined1 local_820 [8];
  JSON j_outline;
  QPDFOutlineObjectHelper *oiter;
  iterator __end2_2;
  iterator __begin2_2;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *__range2_2;
  undefined1 local_7e8 [8];
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> outlines;
  allocator<char> local_7b9;
  JSON local_7b8 [2];
  undefined1 local_798 [8];
  JSON j_outlines;
  JSON local_778;
  allocator<char> local_761;
  JSON local_760 [2];
  JSON local_740;
  JSON local_730;
  JSON local_720;
  reference local_710;
  QPDFObjectHandle *iter2_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2_1;
  allocator<char> local_6c1;
  JSON local_6c0 [2];
  undefined1 local_6a0 [8];
  JSON j_contents;
  JSON local_688 [2];
  JSON local_668;
  JSON local_658;
  allocator<char> local_641;
  JSON local_640 [2];
  JSON local_620;
  JSON local_610;
  allocator<char> local_5f9;
  JSON local_5f8 [2];
  JSON local_5d8;
  int local_5c4;
  undefined1 local_5c0 [4];
  int i;
  undefined1 local_5b0 [8];
  QPDFObjectHandle dp_array;
  string local_598 [32];
  undefined1 local_578 [8];
  QPDFObjectHandle decode_parms;
  allocator<char> local_551;
  JSON local_550 [2];
  JSON local_530;
  allocator<char> local_519;
  string local_518 [32];
  QPDFObjectHandle local_4f8;
  undefined1 local_4e8 [8];
  QPDFObjectHandle filters;
  string local_4d0 [32];
  QPDFObjectHandle local_4b0;
  JSON local_4a0;
  allocator<char> local_489;
  JSON local_488 [2];
  JSON local_468;
  allocator<char> local_451;
  string local_450 [32];
  QPDFObjectHandle local_430;
  JSON local_420;
  allocator<char> local_409;
  JSON local_408 [2];
  JSON local_3e8;
  allocator<char> local_3d1;
  string local_3d0 [32];
  QPDFObjectHandle local_3b0;
  JSON local_3a0;
  allocator<char> local_389;
  JSON local_388 [2];
  JSON local_368;
  allocator<char> local_351;
  string local_350 [32];
  QPDFObjectHandle local_330;
  JSON local_320;
  allocator<char> local_309;
  JSON local_308 [2];
  JSON local_2e8;
  JSON local_2d8;
  allocator<char> local_2c1;
  JSON local_2c0 [2];
  JSON local_2a0;
  undefined1 local_290 [8];
  QPDFObjectHandle dict;
  QPDFObjectHandle image;
  allocator<char> local_259;
  JSON local_258 [2];
  JSON local_238;
  JSON local_228;
  undefined1 local_218 [8];
  JSON j_image;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter2;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  allocator<char> local_1a1;
  JSON local_1a0 [2];
  undefined1 local_180 [8];
  JSON j_images;
  allocator<char> local_159;
  JSON local_158 [2];
  JSON local_138;
  QPDFObjectHandle page;
  JSON j_page;
  QPDFPageObjectHelper *ph;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_f8;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_c8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_b0;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_a0 [4];
  int pageno;
  QPDFOutlineDocumentHelper odh;
  QPDFPageLabelDocumentHelper pldh;
  bool first_page;
  allocator<char> local_49;
  string local_48;
  QPDF *local_28;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  local_28 = pdf;
  pdf_local = (QPDF *)first;
  first_local = (bool *)p;
  p_local = (Pipeline *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"pages",&local_49);
  JSON::writeDictionaryKey(p,first,&local_48,1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pldh.m.super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  JSON::writeArrayOpen
            ((Pipeline *)first_local,
             (bool *)((long)&pldh.m.
                             super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 3),2);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)
             &odh.m.
              super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_28);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)local_a0,local_28);
  __range1._4_4_ = -1;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,local_28);
  QPDFPageDocumentHelper::getAllPages(&local_c8,(QPDFPageDocumentHelper *)&__begin1);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_b0 = &local_c8;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_b0)
  ;
  local_f8._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_b0);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_f8), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
              ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    JSON::makeDictionary();
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xfffffffffffffed8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_158,"object",&local_159);
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)
               &j_images.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(int)&stack0xfffffffffffffed8,SUB41(peVar4->json_version,0));
    JSON::addDictionaryMember
              (&local_138,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_158);
    JSON::~JSON(&local_138);
    JSON::~JSON((JSON *)&j_images.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::__cxx11::string::~string((string *)local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"images",&local_1a1);
    JSON::makeArray();
    JSON::addDictionaryMember
              ((JSON *)local_180,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_1a0);
    JSON::~JSON((JSON *)&__range2);
    std::__cxx11::string::~string((string *)local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    QPDFPageObjectHelper::getImages_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                *)&__begin2,this_00);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)&__begin2);
    iter2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)&__begin2);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&iter2), bVar2) {
      j_image.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
           ::operator*(&__end2);
      JSON::makeDictionary();
      JSON::addArrayElement((JSON *)local_218,(JSON *)local_180);
      JSON::~JSON(&local_228);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_258,"name",&local_259);
      JSON::makeString((JSON *)&image.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,
                       (string *)
                       j_image.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
      JSON::addDictionaryMember(&local_238,(string *)local_218,local_258);
      JSON::~JSON(&local_238);
      JSON::~JSON((JSON *)&image.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_258);
      std::allocator<char>::~allocator(&local_259);
      QPDFObjectHandle::QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (QPDFObjectHandle *)
                 (j_image.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 2));
      QPDFObjectHandle::getDict((QPDFObjectHandle *)local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_2c0,"object",&local_2c1);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_2d8,(int)&dict + 8,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_2a0,(string *)local_218,local_2c0);
      JSON::~JSON(&local_2a0);
      JSON::~JSON(&local_2d8);
      std::__cxx11::string::~string((string *)local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_308,"width",&local_309);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_350,"/Width",&local_351);
      QPDFObjectHandle::getKey(&local_330,(string *)local_290);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_320,(int)&local_330,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_2e8,(string *)local_218,local_308);
      JSON::~JSON(&local_2e8);
      JSON::~JSON(&local_320);
      QPDFObjectHandle::~QPDFObjectHandle(&local_330);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator(&local_351);
      std::__cxx11::string::~string((string *)local_308);
      std::allocator<char>::~allocator(&local_309);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_388,"height",&local_389);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3d0,"/Height",&local_3d1);
      QPDFObjectHandle::getKey(&local_3b0,(string *)local_290);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_3a0,(int)&local_3b0,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_368,(string *)local_218,local_388);
      JSON::~JSON(&local_368);
      JSON::~JSON(&local_3a0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
      std::__cxx11::string::~string((string *)local_388);
      std::allocator<char>::~allocator(&local_389);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_408,"colorspace",&local_409);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_450,"/ColorSpace",&local_451);
      QPDFObjectHandle::getKey(&local_430,(string *)local_290);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_420,(int)&local_430,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_3e8,(string *)local_218,local_408);
      JSON::~JSON(&local_3e8);
      JSON::~JSON(&local_420);
      QPDFObjectHandle::~QPDFObjectHandle(&local_430);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator(&local_451);
      std::__cxx11::string::~string((string *)local_408);
      std::allocator<char>::~allocator(&local_409);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_488,"bitspercomponent",&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_4d0,"/BitsPerComponent",
                 (allocator<char> *)
                 ((long)&filters.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey(&local_4b0,(string *)local_290);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_4a0,(int)&local_4b0,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_468,(string *)local_218,local_488);
      JSON::~JSON(&local_468);
      JSON::~JSON(&local_4a0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_4b0);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&filters.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::__cxx11::string::~string((string *)local_488);
      std::allocator<char>::~allocator(&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_518,"/Filter",&local_519);
      QPDFObjectHandle::getKey(&local_4f8,(string *)local_290);
      QPDFObjectHandle::wrapInArray((QPDFObjectHandle *)local_4e8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_4f8);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator(&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_550,"filter",&local_551);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)
                 &decode_parms.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (int)local_4e8,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_530,(string *)local_218,local_550);
      JSON::~JSON(&local_530);
      JSON::~JSON((JSON *)&decode_parms.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_550);
      std::allocator<char>::~allocator(&local_551);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_598,"/DecodeParms",
                 (allocator<char> *)
                 ((long)&dp_array.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_578,(string *)local_290);
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&dp_array.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_5b0);
      bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_578);
      if (bVar2) {
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_5b0,(QPDFObjectHandle *)local_578);
      }
      else {
        QPDFObjectHandle::newArray();
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_5b0,(QPDFObjectHandle *)local_5c0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_5c0);
        for (local_5c4 = 0; iVar1 = local_5c4,
            iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_4e8), iVar1 < iVar3;
            local_5c4 = local_5c4 + 1) {
          QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_5b0,(QPDFObjectHandle *)local_578);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_5f8,"decodeparms",&local_5f9);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_610,(int)local_5b0,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_5d8,(string *)local_218,local_5f8);
      JSON::~JSON(&local_5d8);
      JSON::~JSON(&local_610);
      std::__cxx11::string::~string((string *)local_5f8);
      std::allocator<char>::~allocator(&local_5f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_640,"filterable",&local_641);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      bVar2 = QPDFObjectHandle::pipeStreamData
                        ((QPDFObjectHandle *)
                         &dict.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         (Pipeline *)0x0,0,peVar4->decode_level,true,false);
      JSON::makeBool(&local_658,bVar2);
      JSON::addDictionaryMember(&local_620,(string *)local_218,local_640);
      JSON::~JSON(&local_620);
      JSON::~JSON(&local_658);
      std::__cxx11::string::~string((string *)local_640);
      std::allocator<char>::~allocator(&local_641);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_5b0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_578);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_4e8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_290);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      JSON::~JSON((JSON *)local_218);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            *)&__begin2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_688,"images",
               (allocator<char> *)
               ((long)&j_contents.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    JSON::addDictionaryMember
              (&local_668,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_688);
    JSON::~JSON(&local_668);
    std::__cxx11::string::~string((string *)local_688);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&j_contents.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_6c0,"contents",&local_6c1);
    JSON::makeArray();
    JSON::addDictionaryMember
              ((JSON *)local_6a0,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_6c0);
    JSON::~JSON((JSON *)&__range2_1);
    std::__cxx11::string::~string((string *)local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    QPDFPageObjectHelper::getPageContents
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2_1,this_00);
    __end2_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                         ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2_1
                         );
    iter2_1 = (QPDFObjectHandle *)
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2_1)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                               *)&iter2_1), bVar2) {
      pQVar5 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end2_1);
      local_710 = pQVar5;
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_730,(int)pQVar5,SUB41(peVar4->json_version,0));
      JSON::addArrayElement(&local_720,(JSON *)local_6a0);
      JSON::~JSON(&local_720);
      JSON::~JSON(&local_730);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_760,"label",&local_761);
    QPDFPageLabelDocumentHelper::getLabelForPage
              ((QPDFPageLabelDocumentHelper *)
               &j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (longlong)
               &odh.m.
                super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFObjectHandle::getJSON
              ((QPDFObjectHandle *)&local_778,(int)&j_outlines + 8,SUB41(peVar4->json_version,0));
    JSON::addDictionaryMember
              (&local_740,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_760);
    JSON::~JSON(&local_740);
    JSON::~JSON(&local_778);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_760);
    std::allocator<char>::~allocator(&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_7b8,"outlines",&local_7b9);
    JSON::makeArray();
    JSON::addDictionaryMember
              ((JSON *)local_798,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_7b8);
    JSON::~JSON((JSON *)&outlines.
                         super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
    og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&stack0xfffffffffffffed8);
    QPDFOutlineDocumentHelper::getOutlinesForPage
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
               local_7e8,(QPDFOutlineDocumentHelper *)local_a0,og);
    __end2_2 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::begin
                         ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                           *)local_7e8);
    oiter = (QPDFOutlineObjectHelper *)
            std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                      ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                       local_7e8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                               *)&oiter), bVar2) {
      j_outline.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
           ::operator*(&__end2_2);
      JSON::makeDictionary();
      JSON::addArrayElement((JSON *)local_820,(JSON *)local_798);
      JSON::~JSON(&local_830);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_860,"object",(allocator<char> *)(local_888 + 0x27));
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_888);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)(local_888 + 0x10),(int)local_888,SUB41(peVar4->json_version,0)
                );
      JSON::addDictionaryMember(&local_840,(string *)local_820,local_860);
      JSON::~JSON(&local_840);
      JSON::~JSON((JSON *)(local_888 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_888);
      std::__cxx11::string::~string((string *)local_860);
      std::allocator<char>::~allocator((allocator<char> *)(local_888 + 0x27));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_8b8,"title",&local_8b9);
      QPDFOutlineObjectHelper::getTitle_abi_cxx11_
                (&local_8f0,
                 (QPDFOutlineObjectHelper *)
                 j_outline.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      JSON::makeString(&local_8d0,&local_8f0);
      JSON::addDictionaryMember(&local_898,(string *)local_820,local_8b8);
      JSON::~JSON(&local_898);
      JSON::~JSON(&local_8d0);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::__cxx11::string::~string((string *)local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_920,"dest",(allocator<char> *)(local_948 + 0x27));
      QPDFOutlineObjectHelper::getDest((QPDFOutlineObjectHelper *)local_948);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)(local_948 + 0x10),(int)local_948,SUB41(peVar4->json_version,0)
                );
      JSON::addDictionaryMember(&local_900,(string *)local_820,local_920);
      JSON::~JSON(&local_900);
      JSON::~JSON((JSON *)(local_948 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_948);
      std::__cxx11::string::~string((string *)local_920);
      std::allocator<char>::~allocator((allocator<char> *)(local_948 + 0x27));
      JSON::~JSON((JSON *)local_820);
      __gnu_cxx::
      __normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
      ::operator++(&__end2_2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_978,"pageposfrom1",&local_979);
    JSON::makeInt(&local_990,(long)(__range1._4_4_ + 1));
    JSON::addDictionaryMember
              (&local_958,
               (string *)
               &page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_978);
    JSON::~JSON(&local_958);
    JSON::~JSON(&local_990);
    std::__cxx11::string::~string((string *)local_978);
    std::allocator<char>::~allocator(&local_979);
    JSON::writeArrayItem
              ((Pipeline *)first_local,
               (bool *)((long)&pldh.m.
                               super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 3),
               (JSON *)&page.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,2);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
               local_7e8);
    JSON::~JSON((JSON *)local_798);
    JSON::~JSON((JSON *)local_6a0);
    JSON::~JSON((JSON *)local_180);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffed8);
    JSON::~JSON((JSON *)&page.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_c8);
  JSON::writeArrayClose
            ((Pipeline *)first_local,
             (bool)(pldh.m.
                    super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._3_1_ & 1),1);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper((QPDFOutlineDocumentHelper *)local_a0);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)
             &odh.m.
              super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONPages(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON::writeDictionaryKey(p, first, "pages", 1);
    bool first_page = true;
    JSON::writeArrayOpen(p, first_page, 2);
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFOutlineDocumentHelper odh(pdf);
    int pageno = -1;
    for (auto& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pageno;
        JSON j_page = JSON::makeDictionary();
        QPDFObjectHandle page = ph.getObjectHandle();
        j_page.addDictionaryMember("object", page.getJSON(m->json_version));
        JSON j_images = j_page.addDictionaryMember("images", JSON::makeArray());
        for (auto const& iter2: ph.getImages()) {
            JSON j_image = j_images.addArrayElement(JSON::makeDictionary());
            j_image.addDictionaryMember("name", JSON::makeString(iter2.first));
            QPDFObjectHandle image = iter2.second;
            QPDFObjectHandle dict = image.getDict();
            j_image.addDictionaryMember("object", image.getJSON(m->json_version));
            j_image.addDictionaryMember("width", dict.getKey("/Width").getJSON(m->json_version));
            j_image.addDictionaryMember("height", dict.getKey("/Height").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "colorspace", dict.getKey("/ColorSpace").getJSON(m->json_version));
            j_image.addDictionaryMember(
                "bitspercomponent", dict.getKey("/BitsPerComponent").getJSON(m->json_version));
            QPDFObjectHandle filters = dict.getKey("/Filter").wrapInArray();
            j_image.addDictionaryMember("filter", filters.getJSON(m->json_version));
            QPDFObjectHandle decode_parms = dict.getKey("/DecodeParms");
            QPDFObjectHandle dp_array;
            if (decode_parms.isArray()) {
                dp_array = decode_parms;
            } else {
                dp_array = QPDFObjectHandle::newArray();
                for (int i = 0; i < filters.getArrayNItems(); ++i) {
                    dp_array.appendItem(decode_parms);
                }
            }
            j_image.addDictionaryMember("decodeparms", dp_array.getJSON(m->json_version));
            j_image.addDictionaryMember(
                "filterable",
                JSON::makeBool(image.pipeStreamData(nullptr, 0, m->decode_level, true)));
        }
        j_page.addDictionaryMember("images", j_images);
        JSON j_contents = j_page.addDictionaryMember("contents", JSON::makeArray());
        for (auto& iter2: ph.getPageContents()) {
            j_contents.addArrayElement(iter2.getJSON(m->json_version));
        }
        j_page.addDictionaryMember("label", pldh.getLabelForPage(pageno).getJSON(m->json_version));
        JSON j_outlines = j_page.addDictionaryMember("outlines", JSON::makeArray());
        std::vector<QPDFOutlineObjectHelper> outlines = odh.getOutlinesForPage(page.getObjGen());
        for (auto& oiter: outlines) {
            JSON j_outline = j_outlines.addArrayElement(JSON::makeDictionary());
            j_outline.addDictionaryMember(
                "object", oiter.getObjectHandle().getJSON(m->json_version));
            j_outline.addDictionaryMember("title", JSON::makeString(oiter.getTitle()));
            j_outline.addDictionaryMember("dest", oiter.getDest().getJSON(m->json_version, true));
        }
        j_page.addDictionaryMember("pageposfrom1", JSON::makeInt(1 + pageno));
        JSON::writeArrayItem(p, first_page, j_page, 2);
    }
    JSON::writeArrayClose(p, first_page, 1);
}